

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall EventLoop::wakeup(EventLoop *this)

{
  ssize_t sVar1;
  LogStream *this_00;
  ssize_t n;
  uint64_t one;
  char *in_stack_ffffffffffffefd8;
  Logger *in_stack_ffffffffffffefe0;
  size_t in_stack_ffffffffffffeff8;
  void *in_stack_fffffffffffff000;
  int in_stack_fffffffffffff00c;
  Logger *in_stack_fffffffffffff020;
  
  sVar1 = writen(in_stack_fffffffffffff00c,in_stack_fffffffffffff000,in_stack_ffffffffffffeff8);
  if (sVar1 != 8) {
    Logger::Logger(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8,0);
    Logger::stream((Logger *)&stack0xfffffffffffff010);
    LogStream::operator<<((LogStream *)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
    this_00 = LogStream::operator<<
                        ((LogStream *)in_stack_ffffffffffffefe0,(long)in_stack_ffffffffffffefd8);
    LogStream::operator<<(this_00,in_stack_ffffffffffffefd8);
    Logger::~Logger(in_stack_fffffffffffff020);
  }
  return;
}

Assistant:

void EventLoop::wakeup(){
    uint64_t one = 1;
    ssize_t n = writen(wakeupFd_, (char *)(&one), sizeof one);
    if(n!=sizeof one){
        LOG<<" EventLoop::wakeup() writes "<<n<<" bytes instead of 8";
    }
}